

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

Token * __thiscall wabt::WastLexer::GetIdToken(Token *__return_storage_ptr__,WastLexer *this)

{
  bool bVar1;
  WastLexer *this_local;
  
  ReadChar(this);
  bVar1 = NoTrailingReservedChars(this);
  if (bVar1) {
    TextToken(__return_storage_ptr__,this,Reserved,0);
  }
  else {
    TextToken(__return_storage_ptr__,this,Last_String,0);
  }
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetIdToken() {
  ReadChar();
  if (NoTrailingReservedChars()) {
    return TextToken(TokenType::Reserved);
  }
  return TextToken(TokenType::Var);
}